

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::AddExtraSite
          (S2Builder *this,S2Point *new_site,InputEdgeId max_edge_id,
          MutableS2ShapeIndex *input_edge_index,vector<int,_std::allocator<int>_> *snap_queue)

{
  Result *result;
  pointer pRVar1;
  compact_array_base<int,_std::allocator<int>_> *this_00;
  InputEdgeId e;
  SiteId new_site_id;
  vector<int,_std::allocator<int>_> *local_380;
  _Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  local_378;
  Options options;
  Target local_348;
  VType local_340;
  VType VStack_338;
  VType local_330;
  S2ClosestEdgeQuery query;
  
  new_site_id = (SiteId)(((long)(this->sites_).
                                super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->sites_).
                               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_380 = snap_queue;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&this->sites_,new_site)
  ;
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::Options(&options.super_Options);
  S2ClosestEdgeQuery::Options::set_conservative_max_distance
            ((Options *)&options.super_Options,
             (S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  options.super_Options.include_interiors_ = false;
  S2ClosestEdgeQuery::S2ClosestEdgeQuery
            (&query,&input_edge_index->super_S2ShapeIndex,(Options *)&options.super_Options);
  local_330 = new_site->c_[2];
  local_340 = new_site->c_[0];
  VStack_338 = new_site->c_[1];
  local_348._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_00304ae0;
  S2ClosestEdgeQuery::FindClosestEdges
            ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              *)&local_378,&query,&local_348);
  for (pRVar1 = local_378._M_impl.super__Vector_impl_data._M_start;
      pRVar1 != local_378._M_impl.super__Vector_impl_data._M_finish; pRVar1 = pRVar1 + 1) {
    e = pRVar1->edge_id_;
    this_00 = &(this->edge_sites_).
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[e].
               super_compact_array_base<int,_std::allocator<int>_>;
    gtl::compact_array_base<int,_std::allocator<int>_>::push_back(this_00,&new_site_id);
    SortSitesByDistance(this,(this->input_vertices_).
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (this->input_edges_).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[e].first,
                        (compact_array<int,_std::allocator<int>_> *)this_00);
    if (e <= max_edge_id) {
      std::vector<int,_std::allocator<int>_>::push_back(local_380,&e);
    }
  }
  std::
  _Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ::~_Vector_base(&local_378);
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery(&query);
  return;
}

Assistant:

void S2Builder::AddExtraSite(const S2Point& new_site,
                             InputEdgeId max_edge_id,
                             const MutableS2ShapeIndex& input_edge_index,
                             vector<InputEdgeId>* snap_queue) {
  SiteId new_site_id = sites_.size();
  sites_.push_back(new_site);
  // Find all edges whose distance is <= edge_site_query_radius_ca_.
  S2ClosestEdgeQuery::Options options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  options.set_include_interiors(false);
  S2ClosestEdgeQuery query(&input_edge_index, options);
  S2ClosestEdgeQuery::PointTarget target(new_site);
  for (const auto& result : query.FindClosestEdges(&target)) {
    InputEdgeId e = result.edge_id();
    auto* site_ids = &edge_sites_[e];
    site_ids->push_back(new_site_id);
    SortSitesByDistance(input_vertices_[input_edges_[e].first], site_ids);
    if (e <= max_edge_id) snap_queue->push_back(e);
  }
}